

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qpoint.cpp
# Opt level: O3

QDataStream * operator>>(QDataStream *s,QPointF *p)

{
  long in_FS_OFFSET;
  double y;
  double x;
  double local_38;
  double local_30;
  long local_28;
  
  local_28 = *(long *)(in_FS_OFFSET + 0x28);
  local_30 = -NAN;
  local_38 = -NAN;
  QDataStream::operator>>(s,&local_30);
  QDataStream::operator>>(s,&local_38);
  p->xp = local_30;
  p->yp = local_38;
  if (*(long *)(in_FS_OFFSET + 0x28) == local_28) {
    return s;
  }
  __stack_chk_fail();
}

Assistant:

QDataStream &operator>>(QDataStream &s, QPointF &p)
{
    double x, y;
    s >> x;
    s >> y;
    p.setX(qreal(x));
    p.setY(qreal(y));
    return s;
}